

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O2

void search_min_f_dijkstra
               (vector<int,_std::allocator<int>_> *array,
               vector<bool,_std::allocator<bool>_> *conditional,int from,int to,int *min_dist)

{
  int iVar1;
  size_type __n;
  reference rVar2;
  
  iVar1 = 999999;
  for (__n = (size_type)from; (long)__n <= (long)to; __n = __n + 1) {
    if ((array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[__n] < iVar1) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](conditional,__n);
      if ((*rVar2._M_p & rVar2._M_mask) == 0) {
        iVar1 = (array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[__n];
      }
    }
  }
  std::mutex::lock(&dijkstra_min_dist);
  if (iVar1 < *min_dist) {
    *min_dist = iVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&dijkstra_min_dist);
  return;
}

Assistant:

void search_min_f_dijkstra(vector<int>& array, vector<bool>& conditional, int from, int to, int& min_dist){
    int local_min = MAX_INT;
    for (int i=from; i<=to; i++){
        if (array[i] < local_min && !conditional[i]){
            local_min = array[i];
        }
    }
    dijkstra_min_dist.lock();
    if (local_min < min_dist){
        min_dist = local_min;
    }
    dijkstra_min_dist.unlock();
}